

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecMarkMffc(Abc_Obj_t *pPivot,int nLevelMin,int nMffcMax,int fVeryVerbose,Vec_Int_t *vMffc,
                    Vec_Int_t *vInMffc,Sfm_Tim_t *pTim,Sfm_Mit_t *pMit)

{
  Abc_Ntk_t *pAVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int local_5c;
  int local_58;
  int n;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin3;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vInMffc_local;
  Vec_Int_t *vMffc_local;
  int fVeryVerbose_local;
  int nMffcMax_local;
  int nLevelMin_local;
  Abc_Obj_t *pPivot_local;
  
  if (nMffcMax < 1) {
    __assert_fail("nMffcMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x5b3,
                  "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                 );
  }
  uVar2 = Abc_ObjId(pPivot);
  Vec_IntFill(vMffc,1,uVar2);
  if (pMit == (Sfm_Mit_t *)0x0) {
    if (pTim == (Sfm_Tim_t *)0x0) {
      for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
        pAVar4 = Abc_ObjFanin(pPivot,n);
        iVar3 = Sfm_DecNodeIsMffc(pAVar4,nLevelMin);
        if ((iVar3 != 0) && (iVar3 = Vec_IntSize(vMffc), iVar3 < nMffcMax)) {
          uVar2 = Abc_ObjId(pAVar4);
          Vec_IntPushUnique(vMffc,uVar2);
        }
      }
      for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
        pAVar4 = Abc_ObjFanin(pPivot,n);
        iVar3 = Sfm_DecNodeIsMffc(pAVar4,nLevelMin);
        if ((iVar3 != 0) && (iVar3 = Vec_IntSize(vMffc), iVar3 < nMffcMax)) {
          for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3;
              local_58 = local_58 + 1) {
            pAVar5 = Abc_ObjFanin(pAVar4,local_58);
            iVar3 = Sfm_DecNodeIsMffc(pAVar5,nLevelMin);
            if ((iVar3 != 0) && (iVar3 = Vec_IntSize(vMffc), iVar3 < nMffcMax)) {
              uVar2 = Abc_ObjId(pAVar5);
              Vec_IntPushUnique(vMffc,uVar2);
            }
          }
        }
      }
      for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
        pAVar4 = Abc_ObjFanin(pPivot,n);
        iVar3 = Sfm_DecNodeIsMffc(pAVar4,nLevelMin);
        if ((iVar3 != 0) && (iVar3 = Vec_IntSize(vMffc), iVar3 < nMffcMax)) {
          for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3;
              local_58 = local_58 + 1) {
            pAVar5 = Abc_ObjFanin(pAVar4,local_58);
            iVar3 = Sfm_DecNodeIsMffc(pAVar5,nLevelMin);
            if ((iVar3 != 0) && (iVar3 = Vec_IntSize(vMffc), iVar3 < nMffcMax)) {
              for (local_5c = 0; iVar3 = Abc_ObjFaninNum(pAVar5), local_5c < iVar3;
                  local_5c = local_5c + 1) {
                pAVar6 = Abc_ObjFanin(pAVar5,local_5c);
                iVar3 = Sfm_DecNodeIsMffc(pAVar6,nLevelMin);
                if ((iVar3 != 0) && (iVar3 = Vec_IntSize(vMffc), iVar3 < nMffcMax)) {
                  uVar2 = Abc_ObjId(pAVar6);
                  Vec_IntPushUnique(vMffc,uVar2);
                }
              }
            }
          }
        }
      }
      iVar3 = Vec_IntSize(vMffc);
      if (nMffcMax < iVar3) {
        __assert_fail("Vec_IntSize(vMffc) <= nMffcMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                      ,0x5fb,
                      "void Sfm_DecMarkMffc(Abc_Obj_t *, int, int, int, Vec_Int_t *, Vec_Int_t *, Sfm_Tim_t *, Sfm_Mit_t *)"
                     );
      }
      for (n = 0; iVar3 = Vec_IntSize(vMffc), n < iVar3; n = n + 1) {
        pAVar1 = pPivot->pNtk;
        iVar3 = Vec_IntEntry(vMffc,n);
        pAVar4 = Abc_NtkObj(pAVar1,iVar3);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          (pAVar4->field_6).iTemp = (pAVar4->field_6).iTemp | 8;
        }
      }
      (pPivot->field_6).iTemp = (pPivot->field_6).iTemp | 0x10;
      Vec_IntClear(vInMffc);
      for (n = 0; iVar3 = Vec_IntSize(vMffc), n < iVar3; n = n + 1) {
        pAVar1 = pPivot->pNtk;
        iVar3 = Vec_IntEntry(vMffc,n);
        pAVar4 = Abc_NtkObj(pAVar1,iVar3);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3;
              local_58 = local_58 + 1) {
            pAVar5 = Abc_ObjFanin(pAVar4,local_58);
            iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
            if ((iVar3 != 0) && ((pAVar5->field_6).iTemp == 1)) {
              uVar2 = Abc_ObjId(pAVar5);
              Vec_IntPushUnique(vInMffc,uVar2);
            }
          }
        }
      }
    }
    else {
      (pPivot->field_6).iTemp = (pPivot->field_6).iTemp | 8;
      (pPivot->field_6).iTemp = (pPivot->field_6).iTemp | 0x10;
      Vec_IntClear(vInMffc);
      for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
        pAVar4 = Abc_ObjFanin(pPivot,n);
        iVar3 = Sfm_DecNodeIsMffcInput(pAVar4,nLevelMin,pTim,pPivot);
        if (iVar3 != 0) {
          uVar2 = Abc_ObjId(pAVar4);
          Vec_IntPushUnique(vInMffc,uVar2);
        }
      }
      for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
        pAVar4 = Abc_ObjFanin(pPivot,n);
        for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3;
            local_58 = local_58 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_58);
          iVar3 = Sfm_DecNodeIsMffcInput(pAVar5,nLevelMin,pTim,pPivot);
          if (iVar3 != 0) {
            uVar2 = Abc_ObjId(pAVar5);
            Vec_IntPushUnique(vInMffc,uVar2);
          }
        }
      }
      for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
        pAVar4 = Abc_ObjFanin(pPivot,n);
        for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3;
            local_58 = local_58 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_58);
          for (local_5c = 0; iVar3 = Abc_ObjFaninNum(pAVar5), local_5c < iVar3;
              local_5c = local_5c + 1) {
            pAVar6 = Abc_ObjFanin(pAVar5,local_5c);
            iVar3 = Sfm_DecNodeIsMffcInput(pAVar6,nLevelMin,pTim,pPivot);
            if (iVar3 != 0) {
              uVar2 = Abc_ObjId(pAVar6);
              Vec_IntPushUnique(vInMffc,uVar2);
            }
          }
        }
      }
    }
  }
  else {
    (pPivot->field_6).iTemp = (pPivot->field_6).iTemp | 8;
    (pPivot->field_6).iTemp = (pPivot->field_6).iTemp | 0x10;
    Vec_IntClear(vInMffc);
    for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
      pAVar4 = Abc_ObjFanin(pPivot,n);
      iVar3 = Sfm_DecNodeIsMffcInput2(pAVar4,nLevelMin,pMit,pPivot);
      if (iVar3 != 0) {
        uVar2 = Abc_ObjId(pAVar4);
        Vec_IntPushUnique(vInMffc,uVar2);
      }
    }
    for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
      pAVar4 = Abc_ObjFanin(pPivot,n);
      for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3; local_58 = local_58 + 1)
      {
        pAVar5 = Abc_ObjFanin(pAVar4,local_58);
        iVar3 = Sfm_DecNodeIsMffcInput2(pAVar5,nLevelMin,pMit,pPivot);
        if (iVar3 != 0) {
          uVar2 = Abc_ObjId(pAVar5);
          Vec_IntPushUnique(vInMffc,uVar2);
        }
      }
    }
    for (n = 0; iVar3 = Abc_ObjFaninNum(pPivot), n < iVar3; n = n + 1) {
      pAVar4 = Abc_ObjFanin(pPivot,n);
      for (local_58 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_58 < iVar3; local_58 = local_58 + 1)
      {
        pAVar5 = Abc_ObjFanin(pAVar4,local_58);
        for (local_5c = 0; iVar3 = Abc_ObjFaninNum(pAVar5), local_5c < iVar3;
            local_5c = local_5c + 1) {
          pAVar6 = Abc_ObjFanin(pAVar5,local_5c);
          iVar3 = Sfm_DecNodeIsMffcInput2(pAVar6,nLevelMin,pMit,pPivot);
          if (iVar3 != 0) {
            uVar2 = Abc_ObjId(pAVar6);
            Vec_IntPushUnique(vInMffc,uVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Sfm_DecMarkMffc( Abc_Obj_t * pPivot, int nLevelMin, int nMffcMax, int fVeryVerbose, Vec_Int_t * vMffc, Vec_Int_t * vInMffc, Sfm_Tim_t * pTim, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFanin3, * pObj; int i, k, n;
    assert( nMffcMax > 0 );
    Vec_IntFill( vMffc, 1, Abc_ObjId(pPivot) );
    if ( pMit != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput2(pFanin, nLevelMin, pMit, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput2(pFanin2, nLevelMin, pMit, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput2(pFanin3, nLevelMin, pMit, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );
    }
    else if ( pTim != NULL )
    {
        pPivot->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs (these are low-delay nodes close to the pivot)
        Vec_IntClear(vInMffc);
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffcInput(pFanin, nLevelMin, pTim, pPivot) )
                Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                if ( Sfm_DecNodeIsMffcInput(pFanin2, nLevelMin, pTim, pPivot) )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            Abc_ObjForEachFanin( pFanin, pFanin2, k )
                Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                    if ( Sfm_DecNodeIsMffcInput(pFanin3, nLevelMin, pTim, pPivot) )
                        Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin3) );

/*
        printf( "Node %d: (%.2f)  ", pPivot->Id, Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pPivot)))  );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pFanin), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pFanin))) );
        printf( "\n" );

        printf( "Node %d: ", pPivot->Id );
        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
            printf( "%d: %.2f  ", Abc_ObjLevel(pObj), Scl_Int2Flt(Sfm_ManReadObjDelay(p, Abc_ObjId(pObj))) );
        printf( "\n" );
*/
    }
    else
    {

        // collect MFFC
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin2) );
        Abc_ObjForEachFanin( pPivot, pFanin, i )
            if ( Sfm_DecNodeIsMffc(pFanin, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                Abc_ObjForEachFanin( pFanin, pFanin2, k )
                    if ( Sfm_DecNodeIsMffc(pFanin2, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                        Abc_ObjForEachFanin( pFanin2, pFanin3, n )
                            if ( Sfm_DecNodeIsMffc(pFanin3, nLevelMin) && Vec_IntSize(vMffc) < nMffcMax )
                                Vec_IntPushUnique( vMffc, Abc_ObjId(pFanin3) );
        // mark MFFC
        assert( Vec_IntSize(vMffc) <= nMffcMax );
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            pObj->iTemp |= SFM_MASK_MFFC;
        pPivot->iTemp |= SFM_MASK_PIVOT;
        // collect MFFC inputs
        Vec_IntClear(vInMffc);
        Abc_NtkForEachObjVec( vMffc, pPivot->pNtk, pObj, i )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( Abc_NodeIsTravIdCurrent(pFanin) && pFanin->iTemp == SFM_MASK_PI )
                    Vec_IntPushUnique( vInMffc, Abc_ObjId(pFanin) );

//        printf( "Node %d: ", pPivot->Id );
//        Abc_ObjForEachFanin( pPivot, pFanin, i )
//            printf( "%d ", Abc_ObjFanoutNum(pFanin) );
//        printf( "\n" );

//        Abc_NtkForEachObjVec( vInMffc, pPivot->pNtk, pObj, i )
//            printf( "%d ", Abc_ObjFanoutNum(pObj) );
//        printf( "\n" );

    }
}